

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  bool bVar1;
  Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>
  *elem;
  long in_RDI;
  TermMatcher *in_stack_ffffffffffffffa8;
  DefaultReset *in_stack_ffffffffffffffb0;
  Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>
  *in_stack_ffffffffffffffc0;
  unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
  local_10 [2];
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
                      *)0x352dd8);
  if (bVar1) {
    self((Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *)0x352df7);
    bVar1 = DefaultKeepRecycled::operator()
                      ((DefaultKeepRecycled *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((bVar1) &&
       ((Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,Lib::DefaultReset,Lib::DefaultKeepRecycled>
         ::memAlive & 1) != 0)) {
      in_stack_ffffffffffffffc0 =
           (Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>
            *)(in_RDI + 8);
      self((Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *)0x352e3c);
      DefaultReset::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      elem = mem();
      std::
      unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
      ::unique_ptr(local_10,(unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
                             *)in_stack_ffffffffffffffa8);
      Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>
      ::push(in_stack_ffffffffffffffc0,
             (unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
              *)elem);
      std::
      unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
      ::~unique_ptr((unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
                     *)in_stack_ffffffffffffffc0);
    }
  }
  std::
  unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
  ::~unique_ptr((unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
                 *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }